

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

bool_t memIsZero(void *buf,size_t count)

{
  ulong uVar1;
  word diff;
  
  diff = 0;
  for (; 7 < count; count = count - 8) {
    diff = diff | *buf;
    buf = (void *)((long)buf + 8);
  }
  for (uVar1 = 0; count != uVar1; uVar1 = uVar1 + 1) {
    diff = diff | *(byte *)((long)buf + uVar1);
  }
  return (bool_t)(diff == 0);
}

Assistant:

bool_t SAFE(memIsZero)(const void* buf, size_t count)
{
	register word diff = 0;
	ASSERT(memIsValid(buf, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		diff |= *(const word*)buf;
		buf = (const word*)buf + 1;
	}
	while (count--)
	{
		diff |= *(const octet*)buf;
		buf = (const octet*)buf + 1;
	}
	return (bool_t)wordEq(diff, 0);
}